

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::QueryProfiler::Flush(QueryProfiler *this,OperatorProfiler *profiler)

{
  profiler_settings_t *settings;
  ProfilingInfo *this_00;
  PhysicalOperator *this_01;
  _Hash_node_base *p_Var1;
  table_function_cardinality_t p_Var2;
  ClientContext *pCVar3;
  bool bVar4;
  int iVar5;
  __node_base_ptr p_Var6;
  PhysicalTableScan *pPVar7;
  pointer pNVar8;
  pthread_mutex_t *__mutex;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> cardinality;
  undefined1 local_60 [40];
  __uniq_ptr_data<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true,_true>
  local_38;
  
  __mutex = (pthread_mutex_t *)&this->lock;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true))
       && (this->running == true)) {
      p_Var9 = (profiler->operator_infos)._M_h._M_before_begin._M_nxt;
      local_60._8_8_ = __mutex;
      local_60._16_8_ = profiler;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        local_38.
        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
             (__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
              )&this->tree_map;
        settings = &profiler->settings;
        local_60._24_8_ = &(this->query_info).query_global_info;
        local_60._32_8_ = this;
        do {
          this_01 = (PhysicalOperator *)p_Var9[1]._M_nxt;
          local_60._0_8_ = this_01;
          p_Var6 = ::std::
                   _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::_M_find_before_node
                             ((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_38.
                                 super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                                 .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                                 _M_head_impl,
                              (ulong)this_01 %
                              (((TreeMap *)(local_60._32_8_ + 0x178))->_M_h)._M_bucket_count,
                              (key_type *)local_60,(__hash_code)this_01);
          p_Var1 = p_Var6->_M_nxt[2]._M_nxt;
          bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_TIMING);
          this_00 = (ProfilingInfo *)(p_Var1 + 1);
          if (bVar4) {
            ProfilingInfo::MetricSum<double>(this_00,OPERATOR_TIMING,(double *)(p_Var9 + 6));
          }
          bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_CARDINALITY);
          if (bVar4) {
            ProfilingInfo::MetricSum<unsigned_long>
                      (this_00,OPERATOR_CARDINALITY,(unsigned_long *)(p_Var9 + 7));
          }
          bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_ROWS_SCANNED);
          if (bVar4 && this_01->type == TABLE_SCAN) {
            pPVar7 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>(this_01);
            if (((pPVar7->bind_data).
                 super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                 .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
                 (FunctionData *)0x0) &&
               (p_Var2 = (pPVar7->function).cardinality, p_Var2 != (table_function_cardinality_t)0x0
               )) {
              pCVar3 = *(ClientContext **)local_60._32_8_;
              unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator*(&pPVar7->bind_data);
              (*p_Var2)((ClientContext *)local_60,(FunctionData *)pCVar3);
              if ((PhysicalOperator *)local_60._0_8_ != (PhysicalOperator *)0x0) {
                pNVar8 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                         ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                       *)local_60);
                if (pNVar8->has_estimated_cardinality == true) {
                  pNVar8 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)local_60);
                  ProfilingInfo::MetricSum<unsigned_long>
                            (this_00,OPERATOR_ROWS_SCANNED,&pNVar8->estimated_cardinality);
                }
              }
              if ((PhysicalOperator *)local_60._0_8_ != (PhysicalOperator *)0x0) {
                operator_delete((void *)local_60._0_8_);
              }
            }
          }
          bVar4 = ProfilingInfo::Enabled(settings,RESULT_SET_SIZE);
          if (bVar4) {
            ProfilingInfo::MetricSum<unsigned_long>
                      (this_00,RESULT_SET_SIZE,(unsigned_long *)(p_Var9 + 8));
          }
          bVar4 = ProfilingInfo::Enabled(settings,EXTRA_INFO);
          if (bVar4) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(p_Var1 + 0x16),
                        (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(p_Var9 + 0xb));
            if ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(p_Var9 + 0xb) !=
                (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(p_Var1 + 0x16)) {
              ::std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)(p_Var1 + 0x19),
                         (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(p_Var9 + 0xe));
            }
          }
          bVar4 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_BUFFER_MEMORY);
          if (bVar4) {
            ProfilingInfo::MetricMax<unsigned_long>
                      ((ProfilingInfo *)local_60._24_8_,SYSTEM_PEAK_BUFFER_MEMORY,
                       (unsigned_long *)(p_Var9 + 9));
          }
          bVar4 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_TEMP_DIR_SIZE);
          if (bVar4) {
            ProfilingInfo::MetricMax<unsigned_long>
                      ((ProfilingInfo *)local_60._24_8_,SYSTEM_PEAK_TEMP_DIR_SIZE,
                       (unsigned_long *)(p_Var9 + 10));
          }
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(((DBConfig *)(local_60._16_8_ + 0x10))->extension_parameters)._M_h.
                  _M_element_count);
      __mutex = (pthread_mutex_t *)local_60._8_8_;
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

void QueryProfiler::Flush(OperatorProfiler &profiler) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}
	for (auto &node : profiler.operator_infos) {
		auto &op = node.first.get();
		auto entry = tree_map.find(op);
		D_ASSERT(entry != tree_map.end());

		auto &tree_node = entry->second.get();
		auto &info = tree_node.GetProfilingInfo();

		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_TIMING)) {
			info.MetricSum<double>(MetricsType::OPERATOR_TIMING, node.second.time);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_CARDINALITY)) {
			info.MetricSum<idx_t>(MetricsType::OPERATOR_CARDINALITY, node.second.elements_returned);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_ROWS_SCANNED)) {
			if (op.type == PhysicalOperatorType::TABLE_SCAN) {
				auto &scan_op = op.Cast<PhysicalTableScan>();
				auto &bind_data = scan_op.bind_data;

				if (bind_data && scan_op.function.cardinality) {
					auto cardinality = scan_op.function.cardinality(context, &(*bind_data));
					if (cardinality && cardinality->has_estimated_cardinality) {
						info.MetricSum<idx_t>(MetricsType::OPERATOR_ROWS_SCANNED, cardinality->estimated_cardinality);
					}
				}
			}
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::RESULT_SET_SIZE)) {
			info.MetricSum<idx_t>(MetricsType::RESULT_SET_SIZE, node.second.result_set_size);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::EXTRA_INFO)) {
			info.extra_info = node.second.extra_info;
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::SYSTEM_PEAK_BUFFER_MEMORY)) {
			query_info.query_global_info.MetricMax(MetricsType::SYSTEM_PEAK_BUFFER_MEMORY,
			                                       node.second.system_peak_buffer_manager_memory);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE)) {
			query_info.query_global_info.MetricMax(MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE,
			                                       node.second.system_peak_temp_directory_size);
		}
	}
	profiler.operator_infos.clear();
}